

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFForceManager::updateSelectionPotentials(SPFForceManager *this)

{
  Snapshot *in_RDI;
  potVec selectionPotentials;
  Snapshot *this_00;
  Vector<double,_7U> *in_stack_ffffffffffffff18;
  Vector<double,_7U> *in_stack_ffffffffffffff20;
  Vector<double,_7U> *in_stack_ffffffffffffffd8;
  Vector<double,_7U> *in_stack_ffffffffffffffe0;
  SPFForceManager *in_stack_ffffffffffffffe8;
  
  Snapshot::getSelectionPotentials(in_RDI);
  Snapshot::getSelectionPotentials(in_RDI);
  linearCombination<OpenMD::Vector<double,7u>>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = (Snapshot *)
            in_RDI[1].rigidbodyData.force.
            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  Vector<double,_7U>::Vector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Snapshot::setSelectionPotentials(this_00,(potVec *)in_RDI);
  return;
}

Assistant:

void SPFForceManager::updateSelectionPotentials() {
    potVec selectionPotentials =
        linearCombination(temporarySourceSnapshot_->getSelectionPotentials(),
                          temporarySinkSnapshot_->getSelectionPotentials());
    currentSnapshot_->setSelectionPotentials(selectionPotentials);
  }